

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

void __thiscall
helics::apps::App::loadJsonFile
          (App *this,string *jsonString,bool enableFederateInterfaceRegistration)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool in_stack_0000004f;
  undefined7 in_stack_00000050;
  allocator<char> local_39 [9];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  loadJsonFileConfiguration
            (this,jsonString,
             (string *)CONCAT17(enableFederateInterfaceRegistration,in_stack_00000050),
             in_stack_0000004f);
  std::__cxx11::string::~string(in_RDI);
  std::allocator<char>::~allocator(local_39);
  return;
}

Assistant:

void App::loadJsonFile(const std::string& jsonString, bool enableFederateInterfaceRegistration)
{
    loadJsonFileConfiguration("application", jsonString, enableFederateInterfaceRegistration);
}